

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast0x10000049.Transform6D.0_1_2_3_4_5.cpp
# Opt level: O2

void IKSolver::polyroots2(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  double dVar1;
  int iVar2;
  double dVar3;
  
  dVar1 = rawcoeffs[1];
  dVar3 = dVar1 * dVar1 + *rawcoeffs * -4.0 * rawcoeffs[2];
  iVar2 = 0;
  if (0.0 <= dVar3) {
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      *rawroots = (dVar3 - rawcoeffs[1]) / (*rawcoeffs + *rawcoeffs);
      rawroots[1] = (-rawcoeffs[1] - dVar3) / (*rawcoeffs + *rawcoeffs);
      iVar2 = 2;
    }
    else {
      *rawroots = (dVar1 * -0.5) / *rawcoeffs;
      iVar2 = 1;
    }
  }
  *numroots = iVar2;
  return;
}

Assistant:

static inline void polyroots2(IkReal rawcoeffs[2+1], IkReal rawroots[2], int& numroots) {
    IkReal det = rawcoeffs[1]*rawcoeffs[1]-4*rawcoeffs[0]*rawcoeffs[2];
    if( det < 0 ) {
        numroots=0;
    }
    else if( det == 0 ) {
        rawroots[0] = -0.5*rawcoeffs[1]/rawcoeffs[0];
        numroots = 1;
    }
    else {
        det = IKsqrt(det);
        rawroots[0] = (-rawcoeffs[1]+det)/(2*rawcoeffs[0]);
        rawroots[1] = (-rawcoeffs[1]-det)/(2*rawcoeffs[0]);//rawcoeffs[2]/(rawcoeffs[0]*rawroots[0]);
        numroots = 2;
    }
}